

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O1

EncodingResult<kj::Array<char32_t>_> * __thiscall
kj::encodeUtf32(EncodingResult<kj::Array<char32_t>_> *__return_storage_ptr__,kj *this,
               ArrayPtr<const_char> text,bool nulTerminate)

{
  char *pcVar1;
  kj kVar2;
  char32_t *pcVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  bool bVar7;
  char *pcVar8;
  Vector<char32_t> local_68;
  ulong local_48;
  uint local_3c;
  EncodingResult<kj::Array<char32_t>_> *local_38;
  
  pcVar5 = text.ptr;
  uVar4 = (uint)text.size_;
  bVar7 = false;
  local_68.builder.ptr =
       (char32_t *)
       _::HeapArrayDisposer::allocateImpl
                 (4,0,(size_t)(pcVar5 + uVar4),(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                 );
  local_68.builder.endPtr = local_68.builder.ptr + (long)(pcVar5 + uVar4);
  local_68.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_68.builder.pos = local_68.builder.ptr;
  if (pcVar5 != (char *)0x0) {
    local_48 = 0;
    pcVar8 = (char *)0x0;
    local_3c = uVar4;
    local_38 = __return_storage_ptr__;
    do {
      pcVar1 = pcVar8 + 1;
      kVar2 = this[(long)pcVar8];
      if ((char)kVar2 < L'\0') {
        if (((0xbf < (byte)kVar2) && (0xdf < (byte)kVar2)) && ((byte)kVar2 < 0xf0)) {
          local_48 = local_48 & 0xffffffff;
        }
        if (local_68.builder.pos == local_68.builder.endPtr) {
          sVar6 = (long)local_68.builder.endPtr - (long)local_68.builder.ptr >> 1;
          if (local_68.builder.endPtr == local_68.builder.ptr) {
            sVar6 = 4;
          }
          Vector<char32_t>::setCapacity(&local_68,sVar6);
        }
        *local_68.builder.pos = L'�';
        local_68.builder.pos = local_68.builder.pos + 1;
        pcVar3 = local_68.builder.pos;
        if (pcVar1 < pcVar5) {
          pcVar3 = (char32_t *)((ulong)local_68.builder.pos & 0xffffffffffffff00);
        }
        local_48 = CONCAT71((int7)((ulong)pcVar3 >> 8),1);
      }
      else {
        if (local_68.builder.pos == local_68.builder.endPtr) {
          sVar6 = (long)local_68.builder.endPtr - (long)local_68.builder.ptr >> 1;
          if (local_68.builder.endPtr == local_68.builder.ptr) {
            sVar6 = 4;
          }
          Vector<char32_t>::setCapacity(&local_68,sVar6);
        }
        *local_68.builder.pos = (int)(char)kVar2;
        local_68.builder.pos = local_68.builder.pos + 1;
      }
      pcVar8 = pcVar1;
    } while (pcVar1 < pcVar5);
    bVar7 = (bool)((byte)local_48 & 1);
    __return_storage_ptr__ = local_38;
    uVar4 = local_3c;
  }
  if ((char)uVar4 != '\0') {
    if (local_68.builder.pos == local_68.builder.endPtr) {
      sVar6 = 4;
      if (local_68.builder.endPtr != local_68.builder.ptr) {
        sVar6 = (long)local_68.builder.endPtr - (long)local_68.builder.ptr >> 1;
      }
      Vector<char32_t>::setCapacity(&local_68,sVar6);
    }
    *local_68.builder.pos = L'\0';
    local_68.builder.pos = local_68.builder.pos + 1;
  }
  if (local_68.builder.pos != local_68.builder.endPtr) {
    Vector<char32_t>::setCapacity
              (&local_68,(long)local_68.builder.pos - (long)local_68.builder.ptr >> 2);
  }
  (__return_storage_ptr__->super_Array<char32_t>).ptr = local_68.builder.ptr;
  (__return_storage_ptr__->super_Array<char32_t>).size_ =
       (long)local_68.builder.pos - (long)local_68.builder.ptr >> 2;
  (__return_storage_ptr__->super_Array<char32_t>).disposer = local_68.builder.disposer;
  __return_storage_ptr__->hadErrors = bVar7;
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<char32_t>> encodeUtf32(ArrayPtr<const char> text, bool nulTerminate) {
  return encodeUtf<char32_t>(text, nulTerminate);
}